

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docs.cpp
# Opt level: O2

void __thiscall docs::DocsParser::error<char_const(&)[30]>(DocsParser *this,char (*args) [30])

{
  char buf [4096];
  
  sprintf(buf,*args);
  printf("%s:%d:%d: %s\n",(this->data->fn)._M_dataplus._M_p,(ulong)(uint)(this->tok).pos.line,
         (ulong)(uint)(this->tok).pos.col,buf);
  exit(1);
}

Assistant:

void error(Args&& ...args) {
    char buf[4096];
    std::sprintf(buf, std::forward<Args>(args)...);
    std::printf("%s:%d:%d: %s\n",
                data.fn.c_str(),
                tok.pos.line,
                tok.pos.col,
                buf);
    std::exit(1);
  }